

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol.cpp
# Opt level: O0

int32_t ucol_getRulesEx_63(UCollator *coll,UColRuleOption delta,UChar *buffer,int32_t bufferLen)

{
  Char16Ptr local_90;
  UErrorCode local_88 [2];
  UErrorCode errorCode;
  RuleBasedCollator *local_78;
  RuleBasedCollator *rbc;
  UnicodeString rules;
  int32_t bufferLen_local;
  UChar *buffer_local;
  UColRuleOption delta_local;
  UCollator *coll_local;
  
  rules.fUnion._52_4_ = bufferLen;
  icu_63::UnicodeString::UnicodeString((UnicodeString *)&rbc);
  local_78 = icu_63::RuleBasedCollator::rbcFromUCollator(coll);
  if ((local_78 != (RuleBasedCollator *)0x0) || (coll == (UCollator *)0x0)) {
    icu_63::RuleBasedCollator::getRules(local_78,delta,(UnicodeString *)&rbc);
  }
  if ((buffer == (UChar *)0x0) || ((int)rules.fUnion._52_4_ < 1)) {
    coll_local._4_4_ = icu_63::UnicodeString::length((UnicodeString *)&rbc);
  }
  else {
    local_88[0] = U_ZERO_ERROR;
    icu_63::Char16Ptr::Char16Ptr(&local_90,buffer);
    coll_local._4_4_ =
         icu_63::UnicodeString::extract
                   ((UnicodeString *)&rbc,&local_90,rules.fUnion._52_4_,local_88);
    icu_63::Char16Ptr::~Char16Ptr(&local_90);
  }
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)&rbc);
  return coll_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_getRulesEx(const UCollator *coll, UColRuleOption delta, UChar *buffer, int32_t bufferLen) {
    UnicodeString rules;
    const RuleBasedCollator *rbc = RuleBasedCollator::rbcFromUCollator(coll);
    if(rbc != NULL || coll == NULL) {
        rbc->getRules(delta, rules);
    }
    if(buffer != NULL && bufferLen > 0) {
        UErrorCode errorCode = U_ZERO_ERROR;
        return rules.extract(buffer, bufferLen, errorCode);
    } else {
        return rules.length();
    }
}